

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ListWindow.cpp
# Opt level: O3

void __thiscall cursespp::ListWindow::PageUp(ListWindow *this)

{
  PageUp((ListWindow *)
         &this[-1].Invalidated.
          super__signal_base2<cursespp::ListWindow_*,_unsigned_long,_sigslot::multi_threaded_local>.
          super__signal_base<sigslot::multi_threaded_local>.super_multi_threaded_local.m_mutex.
          __data.__list);
  return;
}

Assistant:

void ListWindow::PageUp() {
    IScrollAdapter &adapter = this->GetScrollAdapter();
    ScrollPos spos = this->GetScrollPosition();
    int target = (int) this->GetPreviousPageEntryIndex();

    /* if the target position is zero, let it be so the user can see
    the top of the list. otherwise, scroll down by one to give indication
    there is more to see. */
    target = (target > 0) ? target + 1 : 0;

    this->SetSelectedIndex((target == 0) ? 0 : target + 1);
    this->ScrollTo(target);
}